

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O1

CURLcode Curl_auth_create_digest_http_message
                   (Curl_easy *data,char *userp,char *passwdp,uchar *request,uchar *uripath,
                   digestdata *digest,char **outptr,size_t *outlen)

{
  char cVar1;
  bool bVar2;
  CURLcode CVar3;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  int i;
  long lVar10;
  int i_2;
  char *pcVar11;
  uint *buffer;
  uchar md5buf [16];
  char *cnonce;
  size_t cnonce_sz;
  uchar request_digest [33];
  uchar ha1 [33];
  uchar ha2 [33];
  char cnoncebuf [33];
  char *in_stack_fffffffffffffec8;
  undefined4 uVar12;
  byte local_118 [16];
  uchar *local_108;
  char *local_100;
  uchar *local_f8;
  size_t local_f0;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  undefined4 local_dc;
  char local_b8 [48];
  char local_88 [48];
  char local_58 [40];
  
  local_100 = (char *)0x0;
  local_f0 = 0;
  if (digest->nc == 0) {
    digest->nc = 1;
  }
  local_108 = uripath;
  local_f8 = request;
  if (digest->cnonce == (char *)0x0) {
    CVar3 = Curl_rand(data,&local_e8,4);
    if (CVar3 == CURLE_OK) {
      in_stack_fffffffffffffec8 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffec8 >> 0x20),local_dc);
      bVar2 = false;
      curl_msnprintf(local_58,0x21,"%08x%08x%08x%08x",(ulong)local_e8,(ulong)local_e4,
                     (ulong)local_e0,in_stack_fffffffffffffec8);
      sVar8 = strlen(local_58);
      CVar3 = Curl_base64_encode(data,local_58,sVar8,&local_100,&local_f0);
      if (CVar3 == CURLE_OK) {
        digest->cnonce = local_100;
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    if (!bVar2) {
      return CVar3;
    }
  }
  puVar5 = (uchar *)curl_maprintf("%s:%s:%s",userp,digest->realm,passwdp);
  if (puVar5 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_md5it(local_118,puVar5);
  (*Curl_cfree)(puVar5);
  pcVar11 = local_b8;
  lVar10 = 0;
  do {
    curl_msnprintf(pcVar11,3,"%02x",(ulong)local_118[lVar10]);
    lVar10 = lVar10 + 1;
    pcVar11 = pcVar11 + 2;
  } while (lVar10 != 0x10);
  if (digest->algo == 1) {
    pcVar11 = local_b8;
    puVar5 = (uchar *)curl_maprintf("%s:%s:%s",pcVar11,digest->nonce,digest->cnonce);
    if (puVar5 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_md5it(local_118,puVar5);
    (*Curl_cfree)(puVar5);
    lVar10 = 0;
    do {
      curl_msnprintf(pcVar11,3,"%02x",(ulong)local_118[lVar10]);
      lVar10 = lVar10 + 1;
      pcVar11 = pcVar11 + 2;
    } while (lVar10 != 0x10);
  }
  puVar6 = (uchar *)curl_maprintf("%s:%s",local_f8,local_108);
  puVar5 = puVar6;
  if ((digest->qop != (char *)0x0) &&
     (iVar4 = Curl_strcasecompare(digest->qop,"auth-int"), iVar4 != 0)) {
    puVar5 = (uchar *)curl_maprintf("%s:%s",puVar6,"d41d8cd98f00b204e9800998ecf8427e");
    (*Curl_cfree)(puVar6);
  }
  if (puVar5 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_md5it(local_118,puVar5);
  (*Curl_cfree)(puVar5);
  pcVar11 = local_88;
  lVar10 = 0;
  do {
    curl_msnprintf(pcVar11,3,"%02x",(ulong)local_118[lVar10]);
    lVar10 = lVar10 + 1;
    pcVar11 = pcVar11 + 2;
  } while (lVar10 != 0x10);
  if (digest->qop == (char *)0x0) {
    puVar5 = (uchar *)curl_maprintf("%s:%s:%s",local_b8,digest->nonce,local_88);
  }
  else {
    in_stack_fffffffffffffec8 = local_88;
    puVar5 = (uchar *)curl_maprintf("%s:%s:%08x:%s:%s:%s",local_b8,digest->nonce,
                                    (ulong)(uint)digest->nc,digest->cnonce,digest->qop,
                                    in_stack_fffffffffffffec8);
  }
  if (puVar5 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_md5it(local_118,puVar5);
  (*Curl_cfree)(puVar5);
  buffer = &local_e8;
  lVar10 = 0;
  do {
    curl_msnprintf((char *)buffer,3,"%02x",(ulong)local_118[lVar10]);
    uVar12 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    lVar10 = lVar10 + 1;
    buffer = (uint *)((long)buffer + 2);
  } while (lVar10 != 0x10);
  sVar9 = 1;
  pcVar11 = userp;
  do {
    cVar1 = *pcVar11;
    if (cVar1 == '\"') {
LAB_00140538:
      sVar9 = sVar9 + 2;
    }
    else {
      if (cVar1 == '\0') {
        pcVar7 = (char *)(*Curl_cmalloc)(sVar9);
        pcVar11 = pcVar7;
        if (pcVar7 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        do {
          cVar1 = *userp;
          if ((cVar1 == '\"') || (cVar1 == '\\')) {
            *pcVar11 = '\\';
            pcVar11 = pcVar11 + 1;
          }
          else if (cVar1 == '\0') {
            *pcVar11 = '\0';
            if (pcVar7 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            if (digest->qop == (char *)0x0) {
              pcVar11 = curl_maprintf("username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%s\", response=\"%s\""
                                      ,pcVar7,digest->realm,digest->nonce,local_108,&local_e8);
            }
            else {
              pcVar11 = curl_maprintf("username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%s\", cnonce=\"%s\", nc=%08x, qop=%s, response=\"%s\""
                                      ,pcVar7,digest->realm,digest->nonce,local_108,digest->cnonce,
                                      CONCAT44(uVar12,digest->nc),digest->qop,&local_e8);
              iVar4 = Curl_strcasecompare(digest->qop,"auth");
              if (iVar4 != 0) {
                digest->nc = digest->nc + 1;
              }
            }
            (*Curl_cfree)(pcVar7);
            if (pcVar11 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            pcVar7 = pcVar11;
            if (digest->opaque != (char *)0x0) {
              pcVar7 = curl_maprintf("%s, opaque=\"%s\"",pcVar11);
              (*Curl_cfree)(pcVar11);
              if (pcVar7 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            pcVar11 = pcVar7;
            if (digest->algorithm != (char *)0x0) {
              pcVar11 = curl_maprintf("%s, algorithm=\"%s\"",pcVar7);
              (*Curl_cfree)(pcVar7);
              if (pcVar11 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            *outptr = pcVar11;
            sVar8 = strlen(pcVar11);
            *outlen = sVar8;
            return CURLE_OK;
          }
          cVar1 = *userp;
          userp = userp + 1;
          *pcVar11 = cVar1;
          pcVar11 = pcVar11 + 1;
        } while( true );
      }
      if (cVar1 == '\\') goto LAB_00140538;
      sVar9 = sVar9 + 1;
    }
    pcVar11 = pcVar11 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_auth_create_digest_http_message(struct Curl_easy *data,
                                              const char *userp,
                                              const char *passwdp,
                                              const unsigned char *request,
                                              const unsigned char *uripath,
                                              struct digestdata *digest,
                                              char **outptr, size_t *outlen)
{
  CURLcode result;
  unsigned char md5buf[16]; /* 16 bytes/128 bits */
  unsigned char request_digest[33];
  unsigned char *md5this;
  unsigned char ha1[33];    /* 32 digits and 1 zero byte */
  unsigned char ha2[33];    /* 32 digits and 1 zero byte */
  char cnoncebuf[33];
  char *cnonce = NULL;
  size_t cnonce_sz = 0;
  char *userp_quoted;
  char *response = NULL;
  char *tmp = NULL;

  if(!digest->nc)
    digest->nc = 1;

  if(!digest->cnonce) {
    unsigned int rnd[4];
    result = Curl_rand(data, &rnd[0], 4);
    if(result)
      return result;
    snprintf(cnoncebuf, sizeof(cnoncebuf), "%08x%08x%08x%08x",
             rnd[0], rnd[1], rnd[2], rnd[3]);

    result = Curl_base64_encode(data, cnoncebuf, strlen(cnoncebuf),
                                &cnonce, &cnonce_sz);
    if(result)
      return result;

    digest->cnonce = cnonce;
  }

  /*
    If the algorithm is "MD5" or unspecified (which then defaults to MD5):

      A1 = unq(username-value) ":" unq(realm-value) ":" passwd

    If the algorithm is "MD5-sess" then:

      A1 = H(unq(username-value) ":" unq(realm-value) ":" passwd) ":"
           unq(nonce-value) ":" unq(cnonce-value)
  */

  md5this = (unsigned char *)
    aprintf("%s:%s:%s", userp, digest->realm, passwdp);
  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  free(md5this);
  auth_digest_md5_to_ascii(md5buf, ha1);

  if(digest->algo == CURLDIGESTALGO_MD5SESS) {
    /* nonce and cnonce are OUTSIDE the hash */
    tmp = aprintf("%s:%s:%s", ha1, digest->nonce, digest->cnonce);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    CURL_OUTPUT_DIGEST_CONV(data, tmp); /* Convert on non-ASCII machines */
    Curl_md5it(md5buf, (unsigned char *) tmp);
    free(tmp);
    auth_digest_md5_to_ascii(md5buf, ha1);
  }

  /*
    If the "qop" directive's value is "auth" or is unspecified, then A2 is:

      A2 = Method ":" digest-uri-value

    If the "qop" value is "auth-int", then A2 is:

      A2 = Method ":" digest-uri-value ":" H(entity-body)

    (The "Method" value is the HTTP request method as specified in section
    5.1.1 of RFC 2616)
  */

  md5this = (unsigned char *) aprintf("%s:%s", request, uripath);

  if(digest->qop && strcasecompare(digest->qop, "auth-int")) {
    /* We don't support auth-int for PUT or POST at the moment.
       TODO: replace md5 of empty string with entity-body for PUT/POST */
    unsigned char *md5this2 = (unsigned char *)
      aprintf("%s:%s", md5this, "d41d8cd98f00b204e9800998ecf8427e");
    free(md5this);
    md5this = md5this2;
  }

  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  free(md5this);
  auth_digest_md5_to_ascii(md5buf, ha2);

  if(digest->qop) {
    md5this = (unsigned char *) aprintf("%s:%s:%08x:%s:%s:%s",
                                        ha1,
                                        digest->nonce,
                                        digest->nc,
                                        digest->cnonce,
                                        digest->qop,
                                        ha2);
  }
  else {
    md5this = (unsigned char *) aprintf("%s:%s:%s",
                                        ha1,
                                        digest->nonce,
                                        ha2);
  }

  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  free(md5this);
  auth_digest_md5_to_ascii(md5buf, request_digest);

  /* For test case 64 (snooped from a Mozilla 1.3a request)

     Authorization: Digest username="testuser", realm="testrealm", \
     nonce="1053604145", uri="/64", response="c55f7f30d83d774a3d2dcacf725abaca"

     Digest parameters are all quoted strings.  Username which is provided by
     the user will need double quotes and backslashes within it escaped.  For
     the other fields, this shouldn't be an issue.  realm, nonce, and opaque
     are copied as is from the server, escapes and all.  cnonce is generated
     with web-safe characters.  uri is already percent encoded.  nc is 8 hex
     characters.  algorithm and qop with standard values only contain web-safe
     characters.
  */
  userp_quoted = auth_digest_string_quoted(userp);
  if(!userp_quoted)
    return CURLE_OUT_OF_MEMORY;

  if(digest->qop) {
    response = aprintf("username=\"%s\", "
                       "realm=\"%s\", "
                       "nonce=\"%s\", "
                       "uri=\"%s\", "
                       "cnonce=\"%s\", "
                       "nc=%08x, "
                       "qop=%s, "
                       "response=\"%s\"",
                       userp_quoted,
                       digest->realm,
                       digest->nonce,
                       uripath,
                       digest->cnonce,
                       digest->nc,
                       digest->qop,
                       request_digest);

    if(strcasecompare(digest->qop, "auth"))
      digest->nc++; /* The nc (from RFC) has to be a 8 hex digit number 0
                       padded which tells to the server how many times you are
                       using the same nonce in the qop=auth mode */
  }
  else {
    response = aprintf("username=\"%s\", "
                       "realm=\"%s\", "
                       "nonce=\"%s\", "
                       "uri=\"%s\", "
                       "response=\"%s\"",
                       userp_quoted,
                       digest->realm,
                       digest->nonce,
                       uripath,
                       request_digest);
  }
  free(userp_quoted);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Add the optional fields */
  if(digest->opaque) {
    /* Append the opaque */
    tmp = aprintf("%s, opaque=\"%s\"", response, digest->opaque);
    free(response);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  if(digest->algorithm) {
    /* Append the algorithm */
    tmp = aprintf("%s, algorithm=\"%s\"", response, digest->algorithm);
    free(response);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  /* Return the output */
  *outptr = response;
  *outlen = strlen(response);

  return CURLE_OK;
}